

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall nvim::Nvim::del_keymap(Nvim *this,string *mode,string *lhs)

{
  string local_70;
  variant<_cf2d41c5_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nvim_del_keymap","");
  NvimRPC::do_call<std::__cxx11::string,std::__cxx11::string>
            ((Object *)&local_50,&this->client_,&local_70,mode,lhs);
  boost::variant<$cf2d41c5$>::destroy_content(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::del_keymap(const std::string& mode, const std::string& lhs) {
    client_.call("nvim_del_keymap", nullptr, mode, lhs);
}